

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bv.c
# Opt level: O0

unsigned_long bv_get_bits(bv_t *bv,uint numbits)

{
  uint uVar1;
  sbyte sVar2;
  byte bVar3;
  uint local_3c;
  uint local_34;
  uint lastbits;
  uint i;
  unsigned_long res;
  uint len;
  uint overflow;
  uint cidx;
  uint numbits_local;
  bv_t *bv_local;
  
  if (bv == (bv_t *)0x0) {
    __assert_fail("bv != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/bv.c",
                  0x4c,"unsigned long bv_get_bits(bv_t *, unsigned int)");
  }
  if (bv->data != (uchar *)0x0) {
    if (bv->idx < bv->len) {
      len = bv->idx >> 3;
      uVar1 = bv->idx & 7;
      bv->idx = numbits + bv->idx;
      sVar2 = (sbyte)uVar1;
      if (8 - uVar1 < numbits) {
        if (uVar1 == 8) {
          local_3c = 0;
        }
        else {
          local_3c = (uint)bv->data[len] & (2 << (7U - sVar2 & 0x1f)) - 1U;
          len = len + 1;
        }
        _lastbits = (ulong)(int)local_3c;
        for (local_34 = 1; local_34 < numbits + uVar1 >> 3; local_34 = local_34 + 1) {
          _lastbits = _lastbits << 8 | (long)(int)(uint)bv->data[len];
          len = len + 1;
        }
        bVar3 = sVar2 + (char)numbits & 7;
        bv_local = (bv_t *)(_lastbits << bVar3 |
                           (long)((int)(uint)bv->data[len] >> (8 - bVar3 & 0x1f)));
      }
      else {
        bv_local = (bv_t *)(long)((int)((uint)bv->data[len] << sVar2 & 0xff) >>
                                 (8U - (char)numbits & 0x1f));
      }
      return (unsigned_long)bv_local;
    }
    __assert_fail("bv->len > bv->idx",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/bv.c",0x50,
                  "unsigned long bv_get_bits(bv_t *, unsigned int)");
  }
  __assert_fail("bv->data != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/bv.c",0x4d,
                "unsigned long bv_get_bits(bv_t *, unsigned int)");
}

Assistant:

unsigned long bv_get_bits(bv_t *bv, unsigned int numbits) {
  assert(bv != NULL);
  assert(bv->data != NULL);
  assert((numbits <= 32) ||
         "Can not read more than 32 bits from a bit vector");
  assert(bv->len > bv->idx);
  assert(((bv->len - bv->idx) > numbits) ||
         "Bit buffer of bit vector is too small");

  unsigned int cidx = bv->idx >> 3;      /* char index */
  /*M
    Bit overflow from previous char.
  **/
  unsigned int overflow = bv->idx & 0x7;

  bv->idx += numbits;

  /*M
    Most significant bit first.
  **/
  if (numbits <= (8 - overflow))
    return HIGHERBITS(bv->data[cidx] << overflow, numbits);

  /*M
    Length in bytes of bitstring.
  **/
  unsigned int len = ((numbits + overflow) >> 3) + 1;
  /*M
    Number of bits of bitstring in first byte.
  **/
  unsigned long res = LOWERBITS(bv->data[cidx++], 8 - overflow);
  unsigned int i;
  for (i = 1; i < len - 1; i++)
    res = (res << 8) | (bv->data[cidx++] & 0xFF);

  /*M
    Number of bits in last byte.
  **/
  unsigned int lastbits = (overflow + numbits) & 0x07;
  res = (res << lastbits) | HIGHERBITS(bv->data[cidx], lastbits);

  return res;
}